

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

bool QSslSocket::isClassImplemented(ImplementedClass cl,QString *backendName)

{
  long lVar1;
  ImplementedClass *pIVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QList<QSsl::ImplementedClass> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  implementedClasses(&local_30,backendName);
  if (local_30.d.size == 0) {
LAB_0024e489:
    bVar4 = false;
  }
  else {
    lVar3 = 0;
    do {
      if (local_30.d.size << 2 == lVar3) goto LAB_0024e489;
      lVar1 = lVar3 + 4;
      pIVar2 = (ImplementedClass *)((long)local_30.d.ptr + lVar3);
      lVar3 = lVar1;
    } while (*pIVar2 != cl);
    bVar4 = lVar1 != 0;
  }
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::isClassImplemented(QSsl::ImplementedClass cl, const QString &backendName)
{
    return implementedClasses(backendName).contains(cl);
}